

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

void lwlog::registry::init_default_logger(void)

{
  unique_ptr<lwlog::logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>,_std::default_delete<lwlog::logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>_>_>
  local_10;
  
  std::
  make_unique<lwlog::logger<lwlog::configuration<lwlog::disable_local_time,lwlog::enable_thread_id,lwlog::enable_process_id,lwlog::enable_topics>,lwlog::synchronous_policy,lwlog::immediate_flush_policy,lwlog::single_threaded_policy,lwlog::sinks::stdout_sink>,char_const(&)[8]>
            ((char (*) [8])&local_10);
  std::unique_ptr<lwlog::interface::logger,std::default_delete<lwlog::interface::logger>>::operator=
            ((unique_ptr<lwlog::interface::logger,std::default_delete<lwlog::interface::logger>> *)
             &s_default_logger,&local_10);
  std::
  unique_ptr<lwlog::logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>,_std::default_delete<lwlog::logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>_>_>
  ::~unique_ptr(&local_10);
  return;
}

Assistant:

void registry::init_default_logger()
	{
		s_default_logger = std::make_unique<
			logger<
				configuration<
					disable_local_time, 
					enable_thread_id,
					enable_process_id, 
					enable_topics
				>,
				synchronous_policy,
				immediate_flush_policy,
				single_threaded_policy,
				sinks::stdout_sink
			>
		>("DEFAULT");
	}